

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

SuffixImpl * __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name,int kind,int num_values,
          SuffixTable *table)

{
  StringRef name_00;
  _Rb_tree_const_iterator<mp::internal::SuffixBase::Impl> size_00;
  undefined8 uVar1;
  reference pIVar2;
  size_t sVar3;
  char *ptr;
  char *s_00;
  BasicStringRef<char> *this_00;
  undefined1 uVar4;
  BasicSuffixSet<std::allocator<char>_> *in_RDI;
  int in_R8D;
  string *in_R9;
  pair<std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>,_bool> pVar5;
  char *s;
  char *name_copy;
  size_t size;
  Impl *impl;
  pair<std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>,_bool> result;
  undefined8 in_stack_fffffffffffffea8;
  Impl *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  value_type *in_stack_fffffffffffffec8;
  char *local_110;
  size_t local_108;
  BasicStringRef<char> *in_stack_ffffffffffffff00;
  Error *in_stack_ffffffffffffff08;
  CStringRef in_stack_ffffffffffffff10;
  size_t local_e8;
  BasicCStringRef<char> local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  string local_a8 [112];
  _Base_ptr local_38;
  byte local_30;
  string *local_28;
  int local_20;
  BasicStringRef<char> local_10;
  
  local_28 = in_R9;
  local_20 = in_R8D;
  std::__cxx11::string::string(local_a8);
  name_00.size_._0_7_ = in_stack_fffffffffffffec0;
  name_00.data_ = in_stack_fffffffffffffeb8;
  name_00.size_._7_1_ = in_stack_fffffffffffffec7;
  internal::SuffixBase::Impl::Impl
            (in_stack_fffffffffffffeb0,name_00,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             (int)in_stack_fffffffffffffea8,(SuffixTable *)0x152942);
  pVar5 = std::
          set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          ::insert((set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
                    *)in_RDI,in_stack_fffffffffffffec8);
  size_00 = pVar5.first._M_node;
  uVar4 = pVar5.second;
  local_c8 = size_00._M_node;
  local_c0 = uVar4;
  local_38 = size_00._M_node;
  local_30 = uVar4;
  internal::SuffixBase::Impl::~Impl((Impl *)0x1529a4);
  std::__cxx11::string::~string(local_a8);
  if ((local_30 & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_d0,"duplicate suffix \'{}\'");
    Error::Error<fmt::BasicStringRef<char>>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,in_stack_ffffffffffffff00);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  }
  pIVar2 = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator*
                     ((_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl> *)0x152a91);
  sVar3 = fmt::BasicStringRef<char>::size(&local_10);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)&stack0xffffffffffffff10,(char *)0x0,0);
  (pIVar2->name).data_ = in_stack_ffffffffffffff10.data_;
  (pIVar2->name).size_ = local_e8;
  ptr = Allocate<char>(in_RDI,(size_t)size_00._M_node);
  s_00 = fmt::BasicStringRef<char>::data(&local_10);
  this_00 = (BasicStringRef<char> *)(s_00 + sVar3);
  fmt::internal::make_ptr<char>(ptr,sVar3);
  std::copy<char_const*,char*>
            ((char *)CONCAT17(uVar4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8,
             (char *)this_00);
  ptr[sVar3] = '\0';
  fmt::BasicStringRef<char>::BasicStringRef(this_00,s_00);
  (pIVar2->name).data_ = local_110;
  (pIVar2->name).size_ = local_108;
  pIVar2->num_values = local_20;
  std::__cxx11::string::operator=((string *)&pIVar2->table,local_28);
  return pIVar2;
}

Assistant:

typename BasicSuffixSet<Alloc>::SuffixImpl *BasicSuffixSet<Alloc>::DoAdd(
    fmt::StringRef name, int kind, int num_values,
    const SuffixTable& table) {
  std::pair<typename Set::iterator, bool> result =
      set_.insert(Suffix::Impl(name, kind));
  if (!result.second)
    throw Error("duplicate suffix '{}'", name);
  Suffix::Impl *impl = const_cast<SuffixImpl*>(&*result.first);
  /// Set name to empty string so that it is not deleted if new throws.
  std::size_t size = name.size();
  impl->name = fmt::StringRef(0, 0);
  char *name_copy = Allocate<char>(size + 1);
  const char *s = name.data();
  std::copy(s, s + size, fmt::internal::make_ptr(name_copy, size));
  name_copy[size] = 0;
  impl->name = name_copy;
  impl->num_values = num_values;
  impl->table = table;
  return impl;
}